

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTiming.c
# Opt level: O1

void Aig_ManUpdateReverseLevel(Aig_Man_t *p,Aig_Obj_t *pObjNew)

{
  int iVar1;
  Aig_Obj_t *pObj;
  Vec_Int_t *pVVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  Vec_Vec_t *pVVar6;
  void **ppvVar7;
  int in_EDX;
  int extraout_EDX;
  int extraout_EDX_00;
  int Fill;
  int Fill_00;
  long lVar8;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar9;
  void *pvVar10;
  int iVar11;
  ulong uVar12;
  
  if (p->vLevelR == (Vec_Int_t *)0x0) {
    __assert_fail("p->vLevelR != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigTiming.c"
                  ,0xfb,"void Aig_ManUpdateReverseLevel(Aig_Man_t *, Aig_Obj_t *)");
  }
  if ((*(uint *)&pObjNew->field_0x18 & 7) - 7 < 0xfffffffe) {
    __assert_fail("Aig_ObjIsNode(pObjNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigTiming.c"
                  ,0xfc,"void Aig_ManUpdateReverseLevel(Aig_Man_t *, Aig_Obj_t *)");
  }
  if (p->vLevels == (Vec_Vec_t *)0x0) {
    uVar3 = Aig_ManLevels(p);
    pVVar6 = (Vec_Vec_t *)malloc(0x10);
    iVar11 = 8;
    if (uVar3 < 0xfffffff9) {
      iVar11 = uVar3 + 8;
    }
    pVVar6->nSize = 0;
    pVVar6->nCap = iVar11;
    if (iVar11 == 0) {
      ppvVar7 = (void **)0x0;
      in_EDX = extraout_EDX;
    }
    else {
      ppvVar7 = (void **)malloc((long)iVar11 << 3);
      in_EDX = extraout_EDX_00;
    }
    pVVar6->pArray = ppvVar7;
    p->vLevels = pVVar6;
  }
  if (p->vLevelR == (Vec_Int_t *)0x0) {
LAB_006149ae:
    __assert_fail("p->vLevelR",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigTiming.c"
                  ,0x30,"int Aig_ObjReverseLevel(Aig_Man_t *, Aig_Obj_t *)");
  }
  Vec_IntFillExtra(p->vLevelR,pObjNew->Id + 1,in_EDX);
  iVar11 = pObjNew->Id;
  if (((long)iVar11 < 0) || (p->vLevelR->nSize <= iVar11)) {
LAB_0061498f:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  uVar3 = p->vLevelR->pArray[iVar11];
  uVar12 = (ulong)uVar3;
  uVar4 = Aig_ObjReverseLevelNew(p,pObjNew);
  if (uVar3 != uVar4) {
    pVVar6 = p->vLevels;
    iVar11 = pVVar6->nSize;
    if (0 < (long)iVar11) {
      ppvVar7 = pVVar6->pArray;
      lVar8 = 0;
      do {
        *(undefined4 *)((long)ppvVar7[lVar8] + 4) = 0;
        lVar8 = lVar8 + 1;
      } while (iVar11 != lVar8);
    }
    Vec_VecPush(pVVar6,uVar3,pObjNew);
    pObjNew->field_0x18 = pObjNew->field_0x18 | 0x10;
    uVar9 = extraout_RDX;
    if ((int)uVar3 < p->vLevels->nSize) {
      do {
        if ((int)uVar3 < 0) {
LAB_006149cd:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecVec.h"
                        ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
        }
        lVar8 = 0;
        while( true ) {
          iVar11 = (int)uVar12;
          if (p->vLevels->nSize <= iVar11) goto LAB_006149cd;
          pvVar10 = p->vLevels->pArray[uVar12];
          if (*(int *)((long)pvVar10 + 4) <= lVar8) break;
          pObj = *(Aig_Obj_t **)(*(long *)((long)pvVar10 + 8) + lVar8 * 8);
          *(ulong *)&pObj->field_0x18 = *(ulong *)&pObj->field_0x18 & 0xffffffffffffffef;
          if (p->vLevelR == (Vec_Int_t *)0x0) goto LAB_006149ae;
          Vec_IntFillExtra(p->vLevelR,pObj->Id + 1,(int)uVar9);
          iVar5 = pObj->Id;
          if (((long)iVar5 < 0) || (p->vLevelR->nSize <= iVar5)) goto LAB_0061498f;
          if (uVar12 != (uint)p->vLevelR->pArray[iVar5]) {
            __assert_fail("LevelOld == Lev",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigTiming.c"
                          ,0x10f,"void Aig_ManUpdateReverseLevel(Aig_Man_t *, Aig_Obj_t *)");
          }
          iVar5 = Aig_ObjReverseLevelNew(p,pObj);
          if (p->vLevelR == (Vec_Int_t *)0x0) {
            __assert_fail("p->vLevelR",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigTiming.c"
                          ,0x43,"void Aig_ObjSetReverseLevel(Aig_Man_t *, Aig_Obj_t *, int)");
          }
          Vec_IntFillExtra(p->vLevelR,pObj->Id + 1,Fill);
          iVar1 = pObj->Id;
          if (((long)iVar1 < 0) || (pVVar2 = p->vLevelR, pVVar2->nSize <= iVar1)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          pVVar2->pArray[iVar1] = iVar5;
          if (pVVar2 == (Vec_Int_t *)0x0) goto LAB_006149ae;
          Vec_IntFillExtra(pVVar2,pObj->Id + 1,Fill_00);
          iVar5 = pObj->Id;
          if (((long)iVar5 < 0) || (pVVar2 = p->vLevelR, pVVar2->nSize <= iVar5)) goto LAB_0061498f;
          uVar9 = extraout_RDX_00;
          if (uVar12 != (uint)pVVar2->pArray[iVar5]) {
            pvVar10 = (void *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
            if (((*(ulong *)((long)pvVar10 + 0x18) & 0x10) == 0) &&
               (((uint)*(ulong *)((long)pvVar10 + 0x18) & 7) - 5 < 2)) {
              if (pVVar2 == (Vec_Int_t *)0x0) goto LAB_006149ae;
              Vec_IntFillExtra(pVVar2,*(int *)((long)pvVar10 + 0x24) + 1,(int)extraout_RDX_00);
              iVar5 = *(int *)((long)pvVar10 + 0x24);
              if (((long)iVar5 < 0) || (p->vLevelR->nSize <= iVar5)) goto LAB_0061498f;
              iVar5 = p->vLevelR->pArray[iVar5];
              if (iVar5 < iVar11) {
                __assert_fail("LevFanin >= Lev",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigTiming.c"
                              ,0x119,"void Aig_ManUpdateReverseLevel(Aig_Man_t *, Aig_Obj_t *)");
              }
              Vec_VecPush(p->vLevels,iVar5,pvVar10);
              *(byte *)((long)pvVar10 + 0x18) = *(byte *)((long)pvVar10 + 0x18) | 0x10;
              uVar9 = extraout_RDX_01;
            }
            pvVar10 = (void *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
            if (((*(ulong *)((long)pvVar10 + 0x18) & 0x10) == 0) &&
               (((uint)*(ulong *)((long)pvVar10 + 0x18) & 7) - 5 < 2)) {
              if (p->vLevelR == (Vec_Int_t *)0x0) goto LAB_006149ae;
              Vec_IntFillExtra(p->vLevelR,*(int *)((long)pvVar10 + 0x24) + 1,(int)uVar9);
              iVar5 = *(int *)((long)pvVar10 + 0x24);
              if (((long)iVar5 < 0) || (p->vLevelR->nSize <= iVar5)) goto LAB_0061498f;
              iVar5 = p->vLevelR->pArray[iVar5];
              if (iVar5 < iVar11) {
                __assert_fail("LevFanin >= Lev",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigTiming.c"
                              ,0x121,"void Aig_ManUpdateReverseLevel(Aig_Man_t *, Aig_Obj_t *)");
              }
              Vec_VecPush(p->vLevels,iVar5,pvVar10);
              *(byte *)((long)pvVar10 + 0x18) = *(byte *)((long)pvVar10 + 0x18) | 0x10;
              uVar9 = extraout_RDX_02;
            }
          }
          lVar8 = lVar8 + 1;
          if ((int)uVar3 < 0) goto LAB_006149cd;
        }
        uVar12 = uVar12 + 1;
      } while ((int)uVar12 < p->vLevels->nSize);
    }
  }
  return;
}

Assistant:

void Aig_ManUpdateReverseLevel( Aig_Man_t * p, Aig_Obj_t * pObjNew )
{
    Aig_Obj_t * pFanin, * pTemp;
    int LevelOld, LevFanin, Lev, k;
    assert( p->vLevelR != NULL );
    assert( Aig_ObjIsNode(pObjNew) );
    // allocate level if needed
    if ( p->vLevels == NULL )
        p->vLevels = Vec_VecAlloc( Aig_ManLevels(p) + 8 );
    // check if level has changed
    LevelOld = Aig_ObjReverseLevel(p, pObjNew);
    if ( LevelOld == Aig_ObjReverseLevelNew(p, pObjNew) )
        return;
    // start the data structure for level update
    // we cannot fail to visit a node when using this structure because the 
    // nodes are stored by their _old_ levels, which are assumed to be correct
    Vec_VecClear( p->vLevels );
    Vec_VecPush( p->vLevels, LevelOld, pObjNew );
    pObjNew->fMarkA = 1;
    // recursively update level
    Vec_VecForEachEntryStart( Aig_Obj_t *, p->vLevels, pTemp, Lev, k, LevelOld )
    {
        pTemp->fMarkA = 0;
        LevelOld = Aig_ObjReverseLevel(p, pTemp); 
        assert( LevelOld == Lev );
        Aig_ObjSetReverseLevel( p, pTemp, Aig_ObjReverseLevelNew(p, pTemp) );
        // if the level did not change, to need to check the fanout levels
        if ( Aig_ObjReverseLevel(p, pTemp) == Lev )
            continue;
        // schedule fanins for level update
        pFanin = Aig_ObjFanin0(pTemp);
        if ( Aig_ObjIsNode(pFanin) && !pFanin->fMarkA )
        {
            LevFanin = Aig_ObjReverseLevel( p, pFanin );
            assert( LevFanin >= Lev );
            Vec_VecPush( p->vLevels, LevFanin, pFanin );
            pFanin->fMarkA = 1;
        }
        pFanin = Aig_ObjFanin1(pTemp);
        if ( Aig_ObjIsNode(pFanin) && !pFanin->fMarkA )
        {
            LevFanin = Aig_ObjReverseLevel( p, pFanin );
            assert( LevFanin >= Lev );
            Vec_VecPush( p->vLevels, LevFanin, pFanin );
            pFanin->fMarkA = 1;
        }
    }
}